

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

_Bool ssh_ntru_server_getkey(ecdh_key *dh,ptrlen remoteKey,BinarySink *bs)

{
  BinarySink *bs_00;
  ptrlen ciphertext;
  ptrlen confirmation_hash;
  char cVar1;
  uint8_t val;
  uint16_t *pubkey;
  ssh_hash *psVar2;
  uint16_t *ciphertext_00;
  strbuf *buf_o;
  mp_int *x;
  size_t byte;
  bool bVar3;
  ptrlen pVar4;
  uint8_t hashdata [64];
  BinarySource src_1 [1];
  BinarySource src [1];
  uint8_t local_c8 [64];
  BinarySource local_88;
  BinarySource local_58;
  
  local_58.len = remoteKey.len;
  local_58.data = remoteKey.ptr;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  local_58.binarysource_ = &local_58;
  pubkey = (uint16_t *)safemalloc(0x2f9,2,0);
  ntru_decode_pubkey(pubkey,0x2f9,0x11ef,&local_58);
  pVar4 = BinarySource_get_data(local_58.binarysource_,0x20);
  if (((local_58.binarysource_)->err == BSE_NO_ERROR) &&
     ((local_58.binarysource_)->len == (local_58.binarysource_)->pos)) {
    psVar2 = sha512_select(&ssh_sha512);
    if (psVar2 != (ssh_hash *)0x0) {
      (*psVar2->vt->reset)(psVar2);
    }
    ciphertext_00 = (uint16_t *)safemalloc(0x2f9,2,0);
    ntru_encrypt(ciphertext_00,(uint16_t *)dh[-4].vt,pubkey,0x2f9,0x11ef);
    ntru_encode_ciphertext(ciphertext_00,0x2f9,0x11ef,(BinarySink *)&(dh[-3].vt)->getkey);
    ntru_confirmation_hash(local_c8,(uint16_t *)dh[-4].vt,pubkey,0x2f9,0x11ef);
    BinarySink_put_data((BinarySink *)&(dh[-2].vt)->getkey,local_c8,0x20);
    ciphertext.ptr = (dh[-3].vt)->free;
    ciphertext.len = (size_t)(dh[-3].vt)->getpublic;
    confirmation_hash.ptr = (dh[-2].vt)->free;
    confirmation_hash.len = (size_t)(dh[-2].vt)->getpublic;
    ntru_session_hash(local_c8,1,(uint16_t *)dh[-4].vt,0x2f9,ciphertext,confirmation_hash);
    BinarySink_put_data(psVar2->binarysink_,local_c8,0x20);
    buf_o = strbuf_new_nm();
    cVar1 = (**(code **)((dh[-1].vt)->new + 0x18))(dh[-1].vt,pVar4.ptr,pVar4.len,buf_o->binarysink_)
    ;
    if (cVar1 == '\0') {
      (*psVar2->vt->free)(psVar2);
    }
    else {
      local_88.data = buf_o->u;
      local_88.len = buf_o->len;
      local_88.binarysource_ = &local_88;
      local_88.pos = 0;
      local_88.err = BSE_NO_ERROR;
      x = BinarySource_get_mp_ssh2(local_88.binarysource_);
      byte = 0x1f;
      do {
        bs_00 = psVar2->binarysink_;
        val = mp_get_byte(x,byte);
        BinarySink_put_byte(bs_00,val);
        bVar3 = byte != 0;
        byte = byte - 1;
      } while (bVar3);
      mp_free(x);
      strbuf_free(buf_o);
      (*psVar2->vt->digest)(psVar2,local_c8);
      (*psVar2->vt->free)(psVar2);
      pVar4.len = 0x40;
      pVar4.ptr = local_c8;
      BinarySink_put_stringpl(bs->binarysink_,pVar4);
    }
    smemclr(local_c8,0x40);
  }
  else {
    smemclr(pubkey,0x5f2);
    safefree(pubkey);
    cVar1 = '\0';
  }
  return (_Bool)cVar1;
}

Assistant:

static bool ssh_ntru_server_getkey(ecdh_key *dh, ptrlen remoteKey,
                                   BinarySink *bs)
{
    ntru_server_key *nk = container_of(dh, ntru_server_key, ek);

    /*
     * In the server, getkey is called first, with the public
     * information received from the client. We expect the client to
     * have sent us a string containing a public key and a Curve25519
     * public point.
     */
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, remoteKey);

    uint16_t *pubkey = snewn(p_LIVE, uint16_t);
    ntru_decode_pubkey(pubkey, p_LIVE, q_LIVE, src);
    ptrlen curve25519_remoteKey = get_data(src, 32);

    if (get_err(src) || get_avail(src)) {
        /* Hard-fail if the input wasn't exactly the right length */ 
        ring_free(pubkey, p_LIVE);
        return false;
    }

    /*
     * Main hash object which will combine the NTRU and Curve25519
     * outputs.
     */
    ssh_hash *h = ssh_hash_new(&ssh_sha512);

    /* Reusable buffer for storing various hash outputs. */
    uint8_t hashdata[64];

    /*
     * NTRU side.
     */
    {
        /* Encrypt the plaintext we generated at construction time,
         * and encode the ciphertext into a strbuf so we can reuse it
         * for both the session hash and sending to the client. */
        uint16_t *ciphertext = snewn(p_LIVE, uint16_t);
        ntru_encrypt(ciphertext, nk->plaintext, pubkey, p_LIVE, q_LIVE);
        ntru_encode_ciphertext(ciphertext, p_LIVE, q_LIVE,
                               BinarySink_UPCAST(nk->ciphertext_encoded));

        /* Compute the confirmation hash, and write it into another
         * strbuf. */
        ntru_confirmation_hash(hashdata, nk->plaintext, pubkey,
                               p_LIVE, q_LIVE);
        put_data(nk->confirmation_hash, hashdata, 32);

        /* Compute the session hash (which is easy on the server side,
         * requiring no conditional substitution). */
        ntru_session_hash(hashdata, 1, nk->plaintext, p_LIVE,
                          ptrlen_from_strbuf(nk->ciphertext_encoded),
                          ptrlen_from_strbuf(nk->confirmation_hash));

        /* And put the NTRU session hash into the main hash object. */
        put_data(h, hashdata, 32);
    }

    /*
     * Curve25519 side.
     */
    {
        strbuf *otherkey = strbuf_new_nm();

        /* Call out to Curve25519 to compute the shared secret from that
         * kex method */
        bool ok = ecdh_key_getkey(nk->curve25519, curve25519_remoteKey,
                                  BinarySink_UPCAST(otherkey));
        /* As on the client side, abort if Curve25519 reported failure */
        if (!ok) {
            ssh_hash_free(h);
            smemclr(hashdata, sizeof(hashdata));
            return false;
        }

        /* As on the client side, decode Curve25519's mpint so we can
         * re-encode it appropriately for our hash preimage */
        BinarySource src[1];
        BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(otherkey));
        mp_int *curvekey = get_mp_ssh2(src);

        for (unsigned i = 32; i-- > 0 ;)
            put_byte(h, mp_get_byte(curvekey, i));

        mp_free(curvekey);
        strbuf_free(otherkey);
    }

    /*
     * Finish up: compute the final output hash (full 64 bytes of
     * SHA-512 this time), and return it encoded as a string.
     */
    ssh_hash_final(h, hashdata);
    put_stringpl(bs, make_ptrlen(hashdata, sizeof(hashdata)));
    smemclr(hashdata, sizeof(hashdata));

    return true;
}